

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

Prog * __thiscall duckdb_re2::Compiler::Finish(Compiler *this,Regexp *re)

{
  Inst *pIVar1;
  Inst *pIVar2;
  bool bVar3;
  Prog *pPVar4;
  int64_t iVar5;
  long lVar6;
  bool prefix_foldcase;
  string prefix;
  bool local_39;
  string local_38;
  
  if (this->failed_ == false) {
    pPVar4 = this->prog_;
    if ((pPVar4->start_ == 0) && (pPVar4->start_unanchored_ == 0)) {
      this->ninst_ = 1;
    }
    pIVar1 = (this->inst_).ptr_._M_t.
             super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
             .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
    (this->inst_).ptr_._M_t.
    super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
    .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl = (Inst *)0x0;
    pIVar2 = (pPVar4->inst_).ptr_._M_t.
             super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
             .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
    (pPVar4->inst_).ptr_._M_t.
    super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
    .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl = pIVar1;
    if (pIVar2 != (Inst *)0x0) {
      operator_delete(pIVar2);
    }
    (pPVar4->inst_).ptr_._M_t.
    super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
    .super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>.
    super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter,_false> =
         (Deleter)(this->inst_).ptr_._M_t.
                  super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                  .super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>.
                  super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter,_false>
    ;
    pPVar4 = this->prog_;
    pPVar4->size_ = this->ninst_;
    Prog::Optimize(pPVar4);
    Prog::Flatten(this->prog_);
    Prog::ComputeByteMap(this->prog_);
    if (this->prog_->reversed_ == false) {
      local_38._M_string_length = 0;
      local_38.field_2._M_local_buf[0] = '\0';
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      bVar3 = Regexp::RequiredPrefixForAccel(re,&local_38,&local_39);
      if (bVar3) {
        Prog::ConfigurePrefixAccel(this->prog_,&local_38,local_39);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p);
      }
    }
    pPVar4 = this->prog_;
    if (this->max_mem_ < 1) {
      iVar5 = 0x100000;
    }
    else {
      lVar6 = (long)pPVar4->size_ * -2;
      if ((pPVar4->list_heads_).ptr_._M_t.
          super___uniq_ptr_impl<unsigned_short,_duckdb_re2::PODArray<unsigned_short>::Deleter>._M_t.
          super__Tuple_impl<0UL,_unsigned_short_*,_duckdb_re2::PODArray<unsigned_short>::Deleter>.
          super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl == (unsigned_short *)0x0) {
        lVar6 = 0;
      }
      lVar6 = this->max_mem_ + (long)pPVar4->size_ * -8 + lVar6 + -0x1b0;
      iVar5 = 0;
      if (0 < lVar6) {
        iVar5 = lVar6;
      }
    }
    pPVar4->dfa_mem_ = iVar5;
    this->prog_ = (Prog *)0x0;
  }
  else {
    pPVar4 = (Prog *)0x0;
  }
  return pPVar4;
}

Assistant:

Prog* Compiler::Finish(Regexp* re) {
  if (failed_)
    return NULL;

  if (prog_->start() == 0 && prog_->start_unanchored() == 0) {
    // No possible matches; keep Fail instruction only.
    ninst_ = 1;
  }

  // Hand off the array to Prog.
  prog_->inst_ = std::move(inst_);
  prog_->size_ = ninst_;

  prog_->Optimize();
  prog_->Flatten();
  prog_->ComputeByteMap();

  if (!prog_->reversed()) {
    std::string prefix;
    bool prefix_foldcase;
    if (re->RequiredPrefixForAccel(&prefix, &prefix_foldcase))
      prog_->ConfigurePrefixAccel(prefix, prefix_foldcase);
  }

  // Record remaining memory for DFA.
  if (max_mem_ <= 0) {
    prog_->set_dfa_mem(1<<20);
  } else {
    int64_t m = max_mem_ - sizeof(Prog);
    m -= prog_->size_*sizeof(Prog::Inst);  // account for inst_
    if (prog_->CanBitState())
      m -= prog_->size_*sizeof(uint16_t);  // account for list_heads_
    if (m < 0)
      m = 0;
    prog_->set_dfa_mem(m);
  }

  Prog* p = prog_;
  prog_ = NULL;
  return p;
}